

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OffsetTable.cpp
# Opt level: O2

int __thiscall ser::OffsetTable::AddNewSavepoint(OffsetTable *this,Savepoint *savepoint,int sid)

{
  iterator iVar1;
  ostream *poVar2;
  SerializationException *pSVar3;
  mapped_type *pmVar4;
  pointer pmVar5;
  pointer pmVar6;
  int iVar7;
  SerializationException exception;
  string local_1c8 [32];
  ostringstream msg;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 *local_190;
  undefined8 *local_188;
  undefined8 local_180;
  
  iVar1 = std::
          _Rb_tree<ser::Savepoint,_std::pair<const_ser::Savepoint,_int>,_std::_Select1st<std::pair<const_ser::Savepoint,_int>_>,_std::less<ser::Savepoint>,_std::allocator<std::pair<const_ser::Savepoint,_int>_>_>
          ::find(&(this->savepointIndex_)._M_t,savepoint);
  if ((_Rb_tree_header *)iVar1._M_node !=
      &(this->savepointIndex_)._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
    poVar2 = std::operator<<((ostream *)&msg,"Error: savepoint ");
    Savepoint::ToString_abi_cxx11_((string *)&exception,savepoint);
    poVar2 = std::operator<<(poVar2,(string *)&exception);
    poVar2 = std::operator<<(poVar2," is already registered in table ");
    poVar2 = std::operator<<(poVar2,"at position ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)&iVar1._M_node[3]._M_left);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&exception);
    exception._0_8_ = &PTR__SerializationException_00135908;
    exception.message_._M_dataplus._M_p = (pointer)&exception.message_.field_2;
    exception.message_._M_string_length = 0;
    exception.message_.field_2._M_local_buf[0] = '\0';
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_assign((string *)&exception.message_);
    std::__cxx11::string::~string(local_1c8);
    pSVar3 = (SerializationException *)__cxa_allocate_exception(0x28);
    SerializationException::SerializationException(pSVar3,&exception);
    __cxa_throw(pSVar3,&SerializationException::typeinfo,
                SerializationException::~SerializationException);
  }
  if (sid < 0) {
    pmVar5 = (this->entries_).
             super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pmVar6 = (this->entries_).
             super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    pmVar5 = (this->entries_).
             super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pmVar6 = (this->entries_).
             super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (((long)pmVar6 - (long)pmVar5) / 0x30 != (ulong)(uint)sid) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
      poVar2 = std::operator<<((ostream *)&msg,"Error: requested ID ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,sid);
      poVar2 = std::operator<<(poVar2," for savepoint ");
      Savepoint::ToString_abi_cxx11_((string *)&exception,savepoint);
      poVar2 = std::operator<<(poVar2,(string *)&exception);
      poVar2 = std::operator<<(poVar2,", but");
      poVar2 = std::operator<<(poVar2," it would be registered with ID ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::operator<<(poVar2,"\n");
      std::__cxx11::string::~string((string *)&exception);
      exception._0_8_ = &PTR__SerializationException_00135908;
      exception.message_._M_dataplus._M_p = (pointer)&exception.message_.field_2;
      exception.message_._M_string_length = 0;
      exception.message_.field_2._M_local_buf[0] = '\0';
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_assign((string *)&exception.message_);
      std::__cxx11::string::~string(local_1c8);
      pSVar3 = (SerializationException *)__cxa_allocate_exception(0x28);
      SerializationException::SerializationException(pSVar3,&exception);
      __cxa_throw(pSVar3,&SerializationException::typeinfo,
                  SerializationException::~SerializationException);
    }
  }
  std::vector<ser::Savepoint,_std::allocator<ser::Savepoint>_>::push_back
            (&this->savepoints_,savepoint);
  local_190 = &uStack_1a0;
  _msg = 0;
  uStack_1a0 = 0;
  local_198 = 0;
  local_180 = 0;
  local_188 = local_190;
  std::
  vector<std::map<std::__cxx11::string,ser::OffsetTable::OffsetTableEntryValue,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ser::OffsetTable::OffsetTableEntryValue>>>,std::allocator<std::map<std::__cxx11::string,ser::OffsetTable::OffsetTableEntryValue,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ser::OffsetTable::OffsetTableEntryValue>>>>>
  ::
  emplace_back<std::map<std::__cxx11::string,ser::OffsetTable::OffsetTableEntryValue,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ser::OffsetTable::OffsetTableEntryValue>>>>
            ((vector<std::map<std::__cxx11::string,ser::OffsetTable::OffsetTableEntryValue,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ser::OffsetTable::OffsetTableEntryValue>>>,std::allocator<std::map<std::__cxx11::string,ser::OffsetTable::OffsetTableEntryValue,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ser::OffsetTable::OffsetTableEntryValue>>>>>
              *)&this->entries_,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>
              *)&msg);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::OffsetTable::OffsetTableEntryValue>_>_>
               *)&msg);
  pmVar4 = std::
           map<ser::Savepoint,_int,_std::less<ser::Savepoint>,_std::allocator<std::pair<const_ser::Savepoint,_int>_>_>
           ::operator[](&this->savepointIndex_,savepoint);
  iVar7 = (int)(((long)pmVar6 - (long)pmVar5) / 0x30);
  *pmVar4 = iVar7;
  return iVar7;
}

Assistant:

int OffsetTable::AddNewSavepoint(const Savepoint& savepoint, int sid)
{
    // Check that savepoint does not exist by looking at the index
    std::map<Savepoint, int>::const_iterator iter = savepointIndex_.find(savepoint);

    if (iter != savepointIndex_.end())
    {
        std::ostringstream msg;
        msg << "Error: savepoint " << savepoint.ToString() << " is already registered in table "
            << "at position " << iter->second << "\n";
        SerializationException exception;
        exception.Init(msg.str());
        throw exception;
    }

    // Check requested ID
    if (sid >= 0 && static_cast<unsigned>(sid) != entries_.size())
    {
        std::ostringstream msg;
        msg << "Error: requested ID " << sid << " for savepoint " << savepoint.ToString() << ", but"
            << " it would be registered with ID " << entries_.size() << "\n";
        SerializationException exception;
        exception.Init(msg.str());
        throw exception;
    }

    // Register savepoint
    sid = entries_.size();
    savepoints_.push_back(savepoint);
    entries_.push_back(OffsetTableEntry());
    savepointIndex_[savepoint] = sid;
    return sid;
}